

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

char * read_file(char *filename)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  char *__ptr;
  
  __stream = fopen(filename,"r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar2 = ftell(__stream);
    if (-1 < (long)sVar2) {
      rewind(__stream);
      __ptr = (char *)(*parson_malloc)(sVar2 + 1);
      if (__ptr != (char *)0x0) {
        sVar2 = fread(__ptr,1,sVar2,__stream);
        if ((sVar2 != 0) && (iVar1 = ferror(__stream), iVar1 == 0)) {
          fclose(__stream);
          __ptr[sVar2] = '\0';
          return __ptr;
        }
        fclose(__stream);
        (*parson_free)(__ptr);
        return (char *)0x0;
      }
    }
    fclose(__stream);
  }
  return (char *)0x0;
}

Assistant:

static char * read_file(const char * filename) {
    FILE *fp = fopen(filename, "r");
    size_t size_to_read = 0;
    size_t size_read = 0;
    long pos;
    char *file_contents;
    if (!fp) {
        return NULL;
    }
    fseek(fp, 0L, SEEK_END);
    pos = ftell(fp);
    if (pos < 0) {
        fclose(fp);
        return NULL;
    }
    size_to_read = pos;
    rewind(fp);
    file_contents = (char*)parson_malloc(sizeof(char) * (size_to_read + 1));
    if (!file_contents) {
        fclose(fp);
        return NULL;
    }
    size_read = fread(file_contents, 1, size_to_read, fp);
    if (size_read == 0 || ferror(fp)) {
        fclose(fp);
        parson_free(file_contents);
        return NULL;
    }
    fclose(fp);
    file_contents[size_read] = '\0';
    return file_contents;
}